

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformui_invalid_location
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  RenderContext *renderCtx;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,puVar1,&local_209);
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1."
             ,&local_231);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-2,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform2i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-2,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform3i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-2,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform4i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-2,0,0,0,0)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-1,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  glu::CallLogWrapper::glUniform2i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-1,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  glu::CallLogWrapper::glUniform3i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-1,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  glu::CallLogWrapper::glUniform4i((CallLogWrapper *)program.m_program.m_info.linkTimeUs,-1,0,0,0,0)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniformui_invalid_location (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1i(-2, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2i(-2, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3i(-2, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4i(-2, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1i(-1, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform2i(-1, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform3i(-1, 0, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniform4i(-1, 0, 0, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.glUseProgram(0);
}